

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

CVmObjList * CVmPack::create_group_sublist(CVmObjList *parent_list,int *parent_cnt)

{
  CVmObjPageEntry *this;
  int iVar1;
  ulong uVar2;
  vm_val_t ele;
  vm_val_t local_28;
  
  local_28.val.obj = CVmObjList::create(0,10);
  local_28.typ = VM_OBJ;
  this = G_obj_table_X.pages_[local_28.val.obj >> 0xc] + (local_28.val.obj & 0xfff);
  uVar2 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
  if (uVar2 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this,0,uVar2 - 1);
  }
  CVmObjList::cons_ensure_space(parent_list,(long)*parent_cnt,10);
  iVar1 = *parent_cnt;
  *parent_cnt = iVar1 + 1;
  CVmObjList::cons_set_element(parent_list,(long)iVar1,&local_28);
  return (CVmObjList *)this;
}

Assistant:

CVmObjList *CVmPack::create_group_sublist(
    VMG_ CVmObjList *parent_list, int *parent_cnt)
{
    /* create the new sublist */
    vm_val_t ele;
    ele.set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *sublst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);

    /* clear it, since we'll be filling it in iteratively */
    sublst->cons_clear();

    /* 
     *   Add it to the parent list.  The parent list is on the stack (or in a
     *   list that's on the stack, or in a list that's in a list on the
     *   stack, etc) - that will protect the new list from premature garbage
     *   collection.
     */
    parent_list->cons_ensure_space(vmg_ *parent_cnt, 10);
    parent_list->cons_set_element((*parent_cnt)++, &ele);

    /* return the sublist */
    return sublst;
}